

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::Parser(Parser *this,char *filepath)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,filepath,&local_9);
  this->klex = (Klex *)0x0;
  (this->currentToken).type = Unknown;
  (this->currentToken).lexeme._M_dataplus._M_p = (pointer)&(this->currentToken).lexeme.field_2;
  (this->currentToken).lexeme._M_string_length = 0;
  (this->currentToken).lexeme.field_2._M_local_buf[0] = '\0';
  (this->currentToken).line = 0;
  (this->currentToken).col = 0;
  this->functionCounter = 0;
  return;
}

Assistant:

Parser::Parser(const char *filepath) : filepath(filepath), klex(nullptr) { }